

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

void M_Drawer(void)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  uint uVar5;
  
  lVar2 = (long)consoleplayer;
  lVar4 = (&DAT_017e5fc8)[lVar2 * 0x54];
  if ((lVar4 != 0) && ((*(byte *)(lVar4 + 0x20) & 0x20) != 0)) {
    (&DAT_017e5fc8)[lVar2 * 0x54] = 0;
    lVar4 = 0;
  }
  uVar5 = 0;
  if ((lVar4 != 0) && (uVar5 = 0, screen->Accel2D == false)) {
    if ((gamestate == GS_TITLELEVEL) || (gamestate == GS_LEVEL)) {
      puVar3 = &players + lVar2 * 0x54;
      if (*(undefined8 **)(lVar4 + 0x230) != (undefined8 *)0x0) {
        puVar3 = *(undefined8 **)(lVar4 + 0x230);
      }
      uVar5 = (int)(*(float *)(puVar3 + 0x35) * 255.0) & 0xffU |
              ((int)(*(float *)((long)puVar3 + 0x1a4) * 255.0) & 0xffU) << 8 |
              ((int)(*(float *)(puVar3 + 0x34) * 255.0) & 0xffU) << 0x10 |
              (int)(*(float *)((long)puVar3 + 0x1ac) * 255.0) << 0x18;
    }
  }
  if ((DMenu::CurrentMenu != (DMenu *)0x0) && (menuactive != MENU_Off)) {
    iVar1 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xb])();
    if ((char)iVar1 != '\0') {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xd])
                (screen,(ulong)uVar5);
      V_SetBorderNeedRefresh();
    }
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[10])();
    return;
  }
  return;
}

Assistant:

void M_Drawer (void) 
{
	player_t *player = &players[consoleplayer];
	AActor *camera = player->camera;
	PalEntry fade = 0;

	if (!screen->Accel2D && camera != NULL && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
	{
		if (camera->player != NULL)
		{
			player = camera->player;
		}
		fade = PalEntry (BYTE(player->BlendA*255), BYTE(player->BlendR*255), BYTE(player->BlendG*255), BYTE(player->BlendB*255));
	}


	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		if (DMenu::CurrentMenu->DimAllowed())
		{
			screen->Dim(fade);
			V_SetBorderNeedRefresh();
		}
		DMenu::CurrentMenu->Drawer();
	}
}